

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSubMeshTextureAlias
          (OgreBinarySerializer *this,SubMesh *submesh)

{
  string local_40;
  
  ReadLine_abi_cxx11_(&local_40,this);
  std::__cxx11::string::operator=
            ((string *)&(submesh->super_ISubMesh).textureAliasName,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  ReadLine_abi_cxx11_(&local_40,this);
  std::__cxx11::string::operator=
            ((string *)&(submesh->super_ISubMesh).textureAliasRef,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadSubMeshTextureAlias(SubMesh *submesh)
{
    submesh->textureAliasName = ReadLine();
    submesh->textureAliasRef = ReadLine();
}